

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O0

int mapSeekPosition(deFilePosition position)

{
  undefined4 local_c;
  deFilePosition position_local;
  
  if (position == DE_FILEPOSITION_BEGIN) {
    local_c = 0;
  }
  else if (position == DE_FILEPOSITION_END) {
    local_c = 2;
  }
  else if (position == DE_FILEPOSITION_CURRENT) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int mapSeekPosition (deFilePosition position)
{
	switch (position)
	{
		case DE_FILEPOSITION_BEGIN:		return SEEK_SET;
		case DE_FILEPOSITION_END:		return SEEK_END;
		case DE_FILEPOSITION_CURRENT:	return SEEK_CUR;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}